

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> * __thiscall
cmGeneratorTarget::GetLinkImplementationClosure(cmGeneratorTarget *this,string *config)

{
  mapped_type *tgts;
  cmLinkImplementationLibraries *pcVar1;
  pointer item;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  tgts = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure>_>_>
         ::operator[](&this->LinkImplClosureMap,config);
  if (tgts->Done == false) {
    tgts->Done = true;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    pcVar1 = GetLinkImplementationLibraries(this,config);
    for (item = (pcVar1->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start;
        item != (pcVar1->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_finish; item = item + 1) {
      processILibs(config,this,&item->super_cmLinkItem,this->LocalGenerator->GlobalGenerator,
                   &tgts->
                    super_vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ,(set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_60);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree(&local_60);
  }
  return &tgts->super_vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>;
}

Assistant:

const std::vector<const cmGeneratorTarget*>&
cmGeneratorTarget::GetLinkImplementationClosure(
  const std::string& config) const
{
  LinkImplClosure& tgts = this->LinkImplClosureMap[config];
  if (!tgts.Done) {
    tgts.Done = true;
    std::set<cmGeneratorTarget const*> emitted;

    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibraries(config);

    for (std::vector<cmLinkImplItem>::const_iterator it =
           impl->Libraries.begin();
         it != impl->Libraries.end(); ++it) {
      processILibs(config, this, *it,
                   this->LocalGenerator->GetGlobalGenerator(), tgts, emitted);
    }
  }
  return tgts;
}